

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O2

ssize_t __thiscall MetaSim::TableOutput::write(TableOutput *this,int __fd,void *__buf,size_t __n)

{
  BaseStat *this_00;
  ostream *poVar1;
  ssize_t sVar2;
  BaseExc *this_01;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  double dVar4;
  allocator local_273;
  allocator local_272;
  allocator local_271;
  string local_270;
  string local_250;
  ofstream f;
  
  if (_created != '\0') {
    std::ofstream::ofstream((ostream *)&f,_fname_abi_cxx11_,_S_out);
    poVar1 = std::operator<<((ostream *)&f,(string *)CONCAT44(in_register_00000034,__fd));
    std::endl<char,std::char_traits<char>>(poVar1);
    puVar3 = &BaseStat::_statList_abi_cxx11_;
    while( true ) {
      puVar3 = (undefined8 *)*puVar3;
      this_00 = (BaseStat *)puVar3[2];
      if (this_00 == (BaseStat *)0x0) break;
      std::__cxx11::string::string((string *)&local_270,(string *)&this_00->_name);
      poVar1 = std::operator<<((ostream *)&f,(string *)&local_270);
      std::operator<<(poVar1,"\t\t | ");
      dVar4 = BaseStat::getMean(this_00);
      poVar1 = std::ostream::_M_insert<double>(dVar4);
      std::operator<<(poVar1,"\t\t | ");
      dVar4 = BaseStat::getConfInterval(this_00,C95);
      poVar1 = std::ostream::_M_insert<double>(dVar4);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&local_270);
    }
    sVar2 = std::ofstream::~ofstream(&f);
    return sVar2;
  }
  this_01 = (BaseExc *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&f,"Init function not called",&local_271);
  std::__cxx11::string::string((string *)&local_270,"TableOutput",&local_272);
  std::__cxx11::string::string((string *)&local_250,"basestat.cpp",&local_273);
  BaseExc::BaseExc(this_01,(string *)&f,&local_270,&local_250);
  __cxa_throw(this_01,&BaseExc::typeinfo,BaseExc::~BaseExc);
}

Assistant:

void TableOutput::write(string message)
    {

        if (!_created) 
            throw BaseExc("Init function not called",
                          "TableOutput",
                          "basestat.cpp");

        ofstream f(_fname.c_str());
        f << message << endl;

        BaseStat::List::const_iterator i  = BaseStat::begin();
        BaseStat* p = *i;
        while (p != NULL) {
            f << p->getName() << "\t\t | "
              << p->getMean() << "\t\t | "
              << p->getConfInterval() << endl;
            ++i;
            p = *i;
        }
    }